

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int read_line(lua_State *L,FILE *f,int chop)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  bool local_2058;
  int local_2054;
  int i;
  char *buff;
  undefined1 auStack_2040 [4];
  int c;
  luaL_Buffer b;
  int chop_local;
  FILE *f_local;
  lua_State *L_local;
  
  buff._4_4_ = 0;
  b.initb._8188_4_ = chop;
  luaL_buffinit(L,(luaL_Buffer *)auStack_2040);
  while (buff._4_4_ != -1 && buff._4_4_ != 10) {
    pcVar1 = luaL_prepbuffsize((luaL_Buffer *)auStack_2040,0x2000);
    local_2054 = 0;
    flockfile((FILE *)f);
    while( true ) {
      bVar3 = false;
      if (local_2054 < 0x2000) {
        buff._4_4_ = getc_unlocked((FILE *)f);
        bVar3 = false;
        if (buff._4_4_ != -1) {
          bVar3 = buff._4_4_ != 10;
        }
      }
      if (!bVar3) break;
      pcVar1[local_2054] = (char)buff._4_4_;
      local_2054 = local_2054 + 1;
    }
    funlockfile((FILE *)f);
    b.size = (long)local_2054 + b.size;
  }
  if ((b.initb._8188_4_ == 0) && (buff._4_4_ == 10)) {
    if (b.b <= b.size) {
      luaL_prepbuffsize((luaL_Buffer *)auStack_2040,1);
    }
    _auStack_2040[b.size] = '\n';
    b.size = b.size + 1;
  }
  luaL_pushresult((luaL_Buffer *)auStack_2040);
  local_2058 = true;
  if (buff._4_4_ != 10) {
    sVar2 = lua_rawlen(L,-1);
    local_2058 = sVar2 != 0;
  }
  return (int)local_2058;
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c = '\0';
  luaL_buffinit(L, &b);
  while (c != EOF && c != '\n') {  /* repeat until end of line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;
    l_unlockfile(f);
    luaL_addsize(&b, i);
  }
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}